

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

void __thiscall
Centaurus::Grammar<unsigned_char>::print_ldfa
          (Grammar<unsigned_char> *this,wostream *os,ATNPath *path)

{
  LookaheadDFA<unsigned_char> ldfa;
  CompositeATN<unsigned_char> catn;
  
  CompositeATN<unsigned_char>::CompositeATN(&catn,this);
  LookaheadDFA<unsigned_char>::LookaheadDFA(&ldfa,&catn,path,true);
  LookaheadDFA<unsigned_char>::print
            (&ldfa,os,&(path->
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ).
                       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].first.m_id);
  NFABase<Centaurus::LDFAState<unsigned_char>_>::~NFABase
            (&ldfa.super_NFABase<Centaurus::LDFAState<unsigned_char>_>);
  CompositeATN<unsigned_char>::~CompositeATN(&catn);
  return;
}

Assistant:

void Grammar<TCHAR>::print_ldfa(std::wostream& os, const ATNPath& path) const
{
    CompositeATN<TCHAR> catn(*this);

    LookaheadDFA<TCHAR> ldfa(catn, path);

    ldfa.print(os, path.leaf_id().str());
}